

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O3

CProcProcessLocalData * __thiscall
CorUnix::CSynchWaitController::GetProcessLocalData(CSynchWaitController *this)

{
  CPalThread *pCVar1;
  CProcProcessLocalData *pCVar2;
  
  pCVar1 = (CPalThread *)pthread_getspecific(thObjKey);
  if (pCVar1 == (CPalThread *)0x0) {
    pCVar1 = CreateCurrentThreadData();
  }
  if (pCVar1 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","GetProcessLocalData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x1f6);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  pCVar2 = this->m_pProcLocalData;
  if (pCVar2 == (CProcProcessLocalData *)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetProcessLocalData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x1f8);
    fprintf(_stderr,
            "Expression: NULL != m_pProcLocalData, Description: Pointer to process local data not yet initialized\n"
           );
    pCVar2 = this->m_pProcLocalData;
  }
  return pCVar2;
}

Assistant:

CProcProcessLocalData * CSynchWaitController::GetProcessLocalData() 
    {
        VALIDATEOBJECT(m_psdSynchData);

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERT_MSG(NULL != m_pProcLocalData,
                    "Pointer to process local data not yet initialized\n");

        return m_pProcLocalData; 
    }